

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

Node * mainposition(Table *t,TValue *key)

{
  uint uVar1;
  uint uVar2;
  lua_CFunction p_Var3;
  double dVar4;
  luai_Cast u;
  int local_20;
  int iStack_1c;
  
  uVar1 = key->tt_ & 0x3f;
  switch(uVar1) {
  case 1:
    uVar1 = ~(-1 << (t->lsizenode & 0x1f)) & (key->value_).b;
    break;
  case 3:
    dVar4 = (key->value_).n + 1.0;
    local_20 = SUB84(dVar4,0);
    iStack_1c = (int)((ulong)dVar4 >> 0x20);
    uVar2 = local_20 + iStack_1c;
    uVar1 = uVar2 & 0x7fffffff;
    if ((uVar2 & 0x7fffffff) != 0) {
      uVar1 = uVar2;
    }
    uVar1 = -uVar1;
    if (-1 < (int)uVar2) {
      uVar1 = uVar2;
    }
    uVar1 = (int)uVar1 % (int)(~(-1 << (t->lsizenode & 0x1f)) | 1U);
    break;
  case 4:
    uVar1 = ~(-1 << (t->lsizenode & 0x1f)) & *(uint *)((key->value_).f + 0xc);
    break;
  default:
    if (uVar1 == 0x14) {
      p_Var3 = (key->value_).f;
      if (p_Var3[10] == (_func_int_lua_State_ptr)0x0) {
        uVar1 = luaS_hash((char *)(p_Var3 + 0x18),*(size_t *)(p_Var3 + 0x10),*(uint *)(p_Var3 + 0xc)
                         );
        *(uint *)(p_Var3 + 0xc) = uVar1;
        p_Var3[10] = (code)0x1;
        p_Var3 = (key->value_).f;
      }
      uVar1 = ~(-1 << (t->lsizenode & 0x1f)) & *(uint *)(p_Var3 + 0xc);
      break;
    }
  case 2:
    uVar1 = (uint)(key->value_).b % (~(-1 << (t->lsizenode & 0x1f)) | 1U);
  }
  return t->node + uVar1;
}

Assistant:

static Node *mainposition (const Table *t, const TValue *key) {
  switch (ttype(key)) {
    case LUA_TNUMBER:
      return hashnum(t, nvalue(key));
    case LUA_TLNGSTR: {
      TString *s = rawtsvalue(key);
      if (s->tsv.extra == 0) {  /* no hash? */
        s->tsv.hash = luaS_hash(getstr(s), s->tsv.len, s->tsv.hash);
        s->tsv.extra = 1;  /* now it has its hash */
      }
      return hashstr(t, rawtsvalue(key));
    }
    case LUA_TSHRSTR:
      return hashstr(t, rawtsvalue(key));
    case LUA_TBOOLEAN:
      return hashboolean(t, bvalue(key));
    case LUA_TLIGHTUSERDATA:
      return hashpointer(t, pvalue(key));
    case LUA_TLCF:
      return hashpointer(t, fvalue(key));
    default:
      return hashpointer(t, gcvalue(key));
  }
}